

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastAdderCLA_int(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int CarryIn)

{
  int iVar1;
  int *pGen;
  int *pPro;
  int *pCar;
  ulong uVar2;
  int Carry;
  int Pro;
  int Gen;
  int local_3c;
  int local_38;
  int local_34;
  
  pGen = (int *)calloc((long)nBits,4);
  pPro = (int *)calloc((long)nBits,4);
  pCar = (int *)calloc((long)(nBits + 1),4);
  if (nBits == 1) {
    local_3c = CarryIn;
    Wlc_BlastFullAdder(pNew,*pAdd0,*pAdd1,CarryIn,&local_3c,pAdd0);
    return;
  }
  if (1 < nBits) {
    *pCar = CarryIn;
    uVar2 = 0;
    do {
      iVar1 = Gia_ManHashAnd(pNew,pAdd0[uVar2],pAdd1[uVar2]);
      pGen[uVar2] = iVar1;
      iVar1 = Gia_ManHashXor(pNew,pAdd0[uVar2],pAdd1[uVar2]);
      pPro[uVar2] = iVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)nBits != uVar2);
    Wlc_BlastAdderCLA_rec(pNew,pGen,pPro,pCar,nBits,&local_34,&local_38);
    uVar2 = 0;
    do {
      iVar1 = Gia_ManHashXor(pNew,pPro[uVar2],pCar[uVar2]);
      pAdd0[uVar2] = iVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)nBits != uVar2);
    if (pGen != (int *)0x0) {
      free(pGen);
    }
    free(pPro);
    free(pCar);
    return;
  }
  __assert_fail("nBits >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0x18c,"void Wlc_BlastAdderCLA_int(Gia_Man_t *, int *, int *, int, int)");
}

Assistant:

void Wlc_BlastAdderCLA_int( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int CarryIn ) // result is in pAdd0
{
    int * pGen = ABC_CALLOC( int, nBits );
    int * pPro = ABC_CALLOC( int, nBits );
    int * pCar = ABC_CALLOC( int, nBits+1 );
    int b, Gen, Pro;
    if ( nBits == 1 )
    {
        int Carry = CarryIn;
        Wlc_BlastFullAdder( pNew, pAdd0[0], pAdd1[0], Carry, &Carry, &pAdd0[0] );
        return;
    }
    assert( nBits >= 2 );
    pCar[0] = CarryIn;
    for ( b = 0; b < nBits; b++ )
    {
        pGen[b] = Gia_ManHashAnd(pNew, pAdd0[b], pAdd1[b]);
        pPro[b] = Gia_ManHashXor(pNew, pAdd0[b], pAdd1[b]);
    }
    Wlc_BlastAdderCLA_rec( pNew, pGen, pPro, pCar, nBits, &Gen, &Pro );
    for ( b = 0; b < nBits; b++ )
        pAdd0[b] = Gia_ManHashXor(pNew, pPro[b], pCar[b]);
    ABC_FREE(pGen);
    ABC_FREE(pPro);
    ABC_FREE(pCar);
}